

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O1

void IKSolver::polyroots3(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  int i;
  long lVar14;
  double dVar15;
  double dVar16;
  bool visited [3];
  IkReal err [3];
  complex<double> coeffs [3];
  double local_108;
  double local_100;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  IkReal *local_e0;
  int *local_d8;
  double local_d0;
  double local_c8;
  ulong local_c0;
  double local_b8 [4];
  double local_98 [8];
  undefined1 local_58 [8];
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  dVar1 = *rawcoeffs;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar4 = 0;
    do {
      *(double *)((long)local_98 + lVar4 * 2) = *(double *)((long)rawcoeffs + lVar4 + 8) / dVar1;
      *(undefined8 *)((long)local_98 + lVar4 * 2 + 8) = 0;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    local_48 = 0.0;
    uStack_40 = 0;
    local_98[6] = 1.0;
    local_98[7] = 0.0;
    local_58 = (undefined1  [8])0x3fd999999999999a;
    dStack_50 = 0.9;
    local_b8[0] = 1.0;
    local_b8[1] = 1.0;
    local_f8 = (undefined1  [8])0x3fd999999999999a;
    uStack_f0 = 0.9;
    local_e0 = rawroots;
    local_d8 = numroots;
    std::complex<double>::operator*=((complex<double> *)local_f8,(complex<double> *)local_58);
    local_48 = (double)local_f8;
    uStack_40 = uStack_f0;
    local_b8[2] = 1.0;
    local_c8 = local_98[0];
    local_d0 = local_98[1];
    uVar6 = 0;
    do {
      lVar4 = 0;
      lVar14 = 0;
      bVar3 = false;
      local_c0 = uVar6;
      do {
        if (2.842170943040401e-14 <= local_b8[lVar14]) {
          lVar5 = lVar14 * 0x10;
          pdVar8 = (double *)(local_58 + lVar5 + -0x10);
          local_108 = *pdVar8 + local_c8;
          local_100 = *(double *)(local_58 + lVar5 + -8) + local_d0;
          lVar13 = 0;
          do {
            local_f8 = (undefined1  [8])*pdVar8;
            uStack_f0 = *(double *)(local_58 + lVar5 + -8);
            std::complex<double>::operator*=
                      ((complex<double> *)local_f8,(complex<double> *)&local_108);
            local_108 = (double)local_f8 + *(double *)((long)local_98 + lVar13 + 0x10);
            local_100 = uStack_f0 + *(double *)((long)local_98 + lVar13 + 0x18);
            lVar13 = lVar13 + 0x10;
          } while (lVar13 != 0x20);
          lVar13 = 0;
          do {
            if (lVar4 != lVar13) {
              dVar1 = *pdVar8;
              dVar2 = *(double *)(local_58 + lVar5 + -8);
              dVar15 = *(double *)((long)local_98 + lVar13 + 0x30);
              dVar16 = *(double *)((long)local_98 + lVar13 + 0x38);
              if ((dVar1 == dVar15) && (!NAN(dVar1) && !NAN(dVar15))) {
                if ((dVar2 == dVar16) && (!NAN(dVar2) && !NAN(dVar16))) goto LAB_00167998;
              }
              local_108 = (double)__divdc3(SUB84(local_108,0),local_100,dVar1 - dVar15,
                                           dVar2 - dVar16);
            }
LAB_00167998:
            lVar13 = lVar13 + 0x10;
          } while (lVar13 != 0x30);
          *pdVar8 = *pdVar8 - local_108;
          *(double *)(local_58 + lVar5 + -8) = *(double *)(local_58 + lVar5 + -8) - local_100;
          dVar1 = cabs(local_108);
          local_b8[lVar14] = dVar1;
          bVar3 = true;
          uVar6 = local_c0;
        }
        lVar14 = lVar14 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar14 != 3);
    } while ((bVar3) && (uVar7 = (int)uVar6 + 1, uVar6 = (ulong)uVar7, uVar7 != 0x6e));
    *local_d8 = 0;
    local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffffff000000);
    uVar6 = 0;
    pdVar8 = &dStack_50;
    iVar9 = 0;
    do {
      if (local_f8[uVar6] == '\0') {
        dVar1 = *(double *)(local_58 + uVar6 * 0x10 + -0x10);
        dVar2 = *(double *)(local_58 + uVar6 * 0x10 + -8);
        iVar10 = 1;
        pdVar11 = pdVar8;
        uVar12 = uVar6;
        dVar15 = dVar1;
        dVar16 = dVar2;
        if (uVar6 < 2) {
          do {
            if ((ABS(dVar1 - pdVar11[-1]) < 1.4901161193847656e-08) &&
               (ABS(dVar2 - *pdVar11) < 0.002)) {
              dVar15 = dVar15 + pdVar11[-1];
              dVar16 = dVar16 + *pdVar11;
              iVar10 = iVar10 + 1;
              local_f8[uVar12 + 1] = 1;
            }
            uVar12 = uVar12 + 1;
            pdVar11 = pdVar11 + 2;
          } while (uVar12 == 1);
        }
        if (1 < iVar10) {
          dVar16 = dVar16 / (double)iVar10;
        }
        if (ABS(dVar16) < 1.4901161193847656e-08) {
          if (1 < iVar10) {
            dVar15 = dVar15 / (double)iVar10;
          }
          lVar4 = (long)iVar9;
          iVar9 = iVar9 + 1;
          *local_d8 = iVar9;
          local_e0[lVar4] = dVar15;
        }
      }
      uVar6 = uVar6 + 1;
      pdVar8 = pdVar8 + 2;
    } while (uVar6 != 3);
  }
  else {
    dVar1 = rawcoeffs[2];
    dVar2 = dVar1 * dVar1 + rawcoeffs[1] * -4.0 * rawcoeffs[3];
    if (0.0 <= dVar2) {
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        *rawroots = (dVar2 - rawcoeffs[2]) / (rawcoeffs[1] + rawcoeffs[1]);
        rawroots[1] = (-rawcoeffs[2] - dVar2) / (rawcoeffs[1] + rawcoeffs[1]);
        *numroots = 2;
      }
      else {
        *rawroots = (dVar1 * -0.5) / rawcoeffs[1];
        *numroots = 1;
      }
    }
    else {
      *numroots = 0;
    }
  }
  return;
}

Assistant:

static inline void polyroots3(IkReal rawcoeffs[3+1], IkReal rawroots[3], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots2(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[3];
    const int maxsteps = 110;
    for(int i = 0; i < 3; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[3];
    IkReal err[3];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 3; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 3; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 3; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 3; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[3] = {false};
    for(int i = 0; i < 3; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 3; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}